

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

void __thiscall
QPixmapStyle::drawRadioButton
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_3)

{
  uint uVar1;
  long lVar2;
  QStyleOptionButton *pQVar3;
  ControlPixmap CVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QPixmapStylePixmap QStack_58;
  ControlPixmap local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  pQVar3 = qstyleoption_cast<QStyleOptionButton_const*>(option);
  uVar1 = (pQVar3->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  bVar5 = (uVar1 & 0x20) != 0;
  CVar4 = RB_Checked;
  if (!bVar5) {
    CVar4 = ((uVar1 & 4) >> 1) + RB_Enabled;
  }
  local_2c = bVar5 + RB_Disabled;
  if ((uVar1 & 1) != 0) {
    local_2c = CVar4;
  }
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            (&QStack_58,(QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar2 + 0xf0),
             &local_2c);
  QPainter::drawPixmap(painter,&(pQVar3->super_QStyleOption).rect,&QStack_58.pixmap);
  QPixmap::~QPixmap(&QStack_58.pixmap);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawRadioButton(const QStyleOption *option,
                                   QPainter *painter, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    const QStyleOptionButton *button = qstyleoption_cast<const QStyleOptionButton*>(option);

    const bool down = button->state & State_Sunken;
    const bool enabled = button->state & State_Enabled;
    const bool on = button->state & State_On;

    ControlPixmap control;
    if (enabled)
        control = on ? RB_Checked : (down ? RB_Pressed : RB_Enabled);
    else
        control = on ? RB_DisabledChecked : RB_Disabled;
    painter->drawPixmap(button->rect, d->pixmaps.value(control).pixmap);
}